

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

bool __thiscall NNTreeIterator::operator==(NNTreeIterator *this,NNTreeIterator *other)

{
  bool bVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  bVar1 = true;
  if ((this->item_number & other->item_number) != 0xffffffff) {
    if ((this->path).
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node._M_size ==
        (other->path).
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node._M_size) {
      p_Var3 = (_List_node_base *)&other->path;
      p_Var2 = (_List_node_base *)&this->path;
      do {
        p_Var2 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                    *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var2 == (_List_node_base *)&this->path) {
          return this->item_number == other->item_number;
        }
        p_Var3 = (((_List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (*(int *)&p_Var2[2]._M_next == *(int *)&p_Var3[2]._M_next);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
NNTreeIterator::operator==(NNTreeIterator const& other) const
{
    if ((this->item_number == -1) && (other.item_number == -1)) {
        return true;
    }
    if (this->path.size() != other.path.size()) {
        return false;
    }
    auto tpi = this->path.begin();
    auto opi = other.path.begin();
    while (tpi != this->path.end()) {
        if (tpi->kid_number != opi->kid_number) {
            return false;
        }
        ++tpi;
        ++opi;
    }
    if (this->item_number != other.item_number) {
        return false;
    }
    return true;
}